

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall kj::_::EagerPromiseNode<kj::_::Void>::destroy(EagerPromiseNode<kj::_::Void> *this)

{
  EagerPromiseNode<kj::_::Void> *this_local;
  
  freePromise<kj::_::EagerPromiseNode<kj::_::Void>>(this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }